

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

int __thiscall
crnlib::sparse_bit_array::find_first_set_bit(sparse_bit_array *this,uint index,uint num)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int set_index_2;
  uint num_trailing_zeros_2;
  uint32 bits_2;
  uint32 msk_1;
  uint group_bit_ofs_1;
  uint32 *pGroup_2;
  uint bits_to_examine_1;
  uint group_index_2;
  int set_index_1;
  uint num_trailing_zeros_1;
  uint32 bits_1;
  uint i;
  uint32 *pGroup_1;
  uint group_index_1;
  int set_index;
  uint num_trailing_zeros;
  uint bits;
  uint32 msk;
  uint32 *pGroup;
  uint bits_to_examine;
  uint max_bits_to_examine;
  uint dword_bit_ofs;
  uint group_bit_ofs;
  uint group_index;
  uint num_local;
  uint index_local;
  sparse_bit_array *this_local;
  
  group_bit_ofs = num;
  group_index = index;
  if (num != 0) {
    for (; (group_index & 0x1ff) != 0 || group_bit_ofs < 0x201; group_index = uVar2 + group_index) {
      uVar2 = math::minimum<unsigned_int>(0x20 - (group_index & 0x1f),group_bit_ofs);
      if ((this->m_ppGroups[group_index >> 9] != (uint32 *)0x0) &&
         (uVar3 = this->m_ppGroups[group_index >> 9][(group_index & 0x1ff) >> 5] &
                  (0xffffffffU >> (0x20U - (char)uVar2 & 0x1f)) << (sbyte)(group_index & 0x1f),
         uVar3 != 0)) {
        uVar1 = math::count_trailing_zero_bits(uVar3);
        return uVar1 + (group_index & 0xffffffe0);
      }
      group_bit_ofs = group_bit_ofs - uVar2;
      if (group_bit_ofs == 0) {
        return -1;
      }
    }
    for (; 0x1ff < group_bit_ofs; group_bit_ofs = group_bit_ofs - 0x200) {
      if (this->m_ppGroups[group_index >> 9] != (uint32 *)0x0) {
        for (num_trailing_zeros_1 = 0; num_trailing_zeros_1 < 0x10;
            num_trailing_zeros_1 = num_trailing_zeros_1 + 1) {
          uVar1 = this->m_ppGroups[group_index >> 9][num_trailing_zeros_1];
          if (uVar1 != 0) {
            uVar1 = math::count_trailing_zero_bits(uVar1);
            return uVar1 + group_index + num_trailing_zeros_1 * 0x20;
          }
        }
      }
      group_index = group_index + 0x200;
    }
    for (; group_bit_ofs != 0; group_bit_ofs = group_bit_ofs - uVar2) {
      uVar2 = math::minimum<unsigned_int>(0x20,group_bit_ofs);
      if ((this->m_ppGroups[group_index >> 9] != (uint32 *)0x0) &&
         (uVar3 = this->m_ppGroups[group_index >> 9][(group_index & 0x1ff) >> 5] &
                  (0xffffffffU >> (0x20U - (char)uVar2 & 0x1f)) <<
                  ((byte)(group_index & 0x1ff) & 0x1f), uVar3 != 0)) {
        uVar1 = math::count_trailing_zero_bits(uVar3);
        return uVar1 + (group_index & 0xffffffe0);
      }
      group_index = uVar2 + group_index;
    }
  }
  return -1;
}

Assistant:

int sparse_bit_array::find_first_set_bit(uint index, uint num) const
    {
        CRNLIB_ASSERT((index + num) <= (m_num_groups << cBitsPerGroupShift));

        if (!num)
        {
            return -1;
        }

        while ((index & cBitsPerGroupMask) || (num <= cBitsPerGroup))
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            const uint group_bit_ofs = index & cBitsPerGroupMask;
            const uint dword_bit_ofs = group_bit_ofs & 31;

            const uint max_bits_to_examine = 32 - dword_bit_ofs;
            const uint bits_to_examine = math::minimum(max_bits_to_examine, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                const uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_examine));

                uint bits = pGroup[group_bit_ofs >> 5] & (msk << dword_bit_ofs);
                if (bits)
                {
                    uint num_trailing_zeros = math::count_trailing_zero_bits(bits);
                    int set_index = num_trailing_zeros + (index & ~31);
                    CRNLIB_ASSERT(get_bit(set_index));
                    return set_index;
                }
            }

            num -= bits_to_examine;
            if (!num)
            {
                return -1;
            }

            index += bits_to_examine;
        }

        while (num >= cBitsPerGroup)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                for (uint i = 0; i < cDWORDsPerGroup; i++)
                {
                    uint32 bits = pGroup[i];
                    if (bits)
                    {
                        uint num_trailing_zeros = math::count_trailing_zero_bits(bits);

                        int set_index = num_trailing_zeros + index + (i << 5);
                        CRNLIB_ASSERT(get_bit(set_index));
                        return set_index;
                    }
                }
            }

            num -= cBitsPerGroup;
            index += cBitsPerGroup;
        }

        while (num)
        {
            uint group_index = index >> cBitsPerGroupShift;
            CRNLIB_ASSERT(group_index < m_num_groups);

            uint bits_to_examine = math::minimum(32U, num);

            uint32* pGroup = m_ppGroups[group_index];
            if (pGroup)
            {
                uint group_bit_ofs = index & cBitsPerGroupMask;

                uint32 msk = (0xFFFFFFFFU >> (32 - bits_to_examine));

                uint32 bits = pGroup[group_bit_ofs >> 5] & (msk << (group_bit_ofs & 31));
                if (bits)
                {
                    uint num_trailing_zeros = math::count_trailing_zero_bits(bits);

                    int set_index = num_trailing_zeros + (index & ~31);
                    CRNLIB_ASSERT(get_bit(set_index));
                    return set_index;
                }
            }

            num -= bits_to_examine;
            index += bits_to_examine;
        }

        return -1;
    }